

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

int stbi_write_hdr(char *filename,int x,int y,int comp,float *data)

{
  uint uVar1;
  FILE *__s;
  uchar *scratch;
  int iVar2;
  ulong uVar3;
  
  uVar1 = 0;
  if (data != (float *)0x0 && (0 < x && 0 < y)) {
    __s = fopen(filename,"wb");
    if (__s != (FILE *)0x0) {
      scratch = (uchar *)malloc((ulong)(uint)(x * 4));
      fwrite("#?RADIANCE\n# Written by stb_image_write.h\nFORMAT=32-bit_rle_rgbe\n",0x41,1,__s);
      iVar2 = 0;
      fprintf(__s,"EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n",(ulong)(uint)y,
              (ulong)(uint)x);
      if (0 < y) {
        uVar3 = (ulong)(uint)y;
        do {
          stbiw__write_hdr_scanline((FILE *)__s,x,comp,scratch,data + iVar2);
          iVar2 = iVar2 + comp * x;
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      free(scratch);
      fclose(__s);
    }
    uVar1 = (uint)(__s != (FILE *)0x0);
  }
  return uVar1;
}

Assistant:

int stbi_write_hdr(char const *filename, int x, int y, int comp, const float *data)
{
   int i;
   FILE *f;
   if (y <= 0 || x <= 0 || data == NULL) return 0;
   f = fopen(filename, "wb");
   if (f) {
      /* Each component is stored separately. Allocate scratch space for full output scanline. */
      unsigned char *scratch = (unsigned char *) STBIW_MALLOC(x*4);
      fprintf(f, "#?RADIANCE\n# Written by stb_image_write.h\nFORMAT=32-bit_rle_rgbe\n"      );
      fprintf(f, "EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n"                 , y, x);
      for(i=0; i < y; i++)
         stbiw__write_hdr_scanline(f, x, comp, scratch, data + comp*i*x);
      STBIW_FREE(scratch);
      fclose(f);
   }
   return f != NULL;
}